

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *help,NullCallback *callback)

{
  function<void_()> local_180;
  Callback local_160;
  allocator local_139;
  string local_138;
  string local_118;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  Option option;
  NullCallback *callback_local;
  char *help_local;
  char *long_name_local;
  char short_name_local;
  OptionParser *this_local;
  
  option.callback._M_invoker = (_Invoker_type)callback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,long_name,&local_e1);
  std::__cxx11::string::string((string *)&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,help,&local_139);
  std::function<void_()>::function(&local_180,(function<void_()> *)option.callback._M_invoker);
  std::function<void(char_const*)>::
  function<wabt::OptionParser::AddOption(char,char_const*,char_const*,std::function<void()>const&)::__0,void>
            ((function<void(char_const*)> *)&local_160,(anon_class_32_1_dda845c3 *)&local_180);
  Option::Option((Option *)local_c0,short_name,&local_e0,&local_118,No,&local_138,&local_160);
  std::function<void_(const_char_*)>::~function(&local_160);
  AddOption(char,char_const*,char_const*,std::function<void()>const&)::$_0::~__0((__0 *)&local_180);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  AddOption(this,(Option *)local_c0);
  Option::~Option((Option *)local_c0);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option(short_name, long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}